

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containsmulti_benchmark.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  roaring_bitmap_t *r;
  FILE *__stream;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  uint32_t *vals;
  uint64_t uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  char **ppcVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  ulong n_args;
  int p;
  long lVar21;
  undefined1 *puVar22;
  long lVar23;
  ulong uVar24;
  char **ppcVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined1 *local_90;
  undefined8 local_88;
  ulong local_80;
  char **local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char **local_60;
  char **local_58;
  undefined1 *local_50;
  undefined1 auStack_48 [8];
  timespec ts;
  
  local_90 = auStack_98;
  if (argc < 2) {
    uStack_a0 = 0x10131c;
    printf("Usage: %s <comma_separated_integers_file> ...\n",*argv);
    uStack_a0 = 0x10132d;
    printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",*argv);
    return 1;
  }
  local_80 = (ulong)(argc - 1);
  local_78 = (char **)(ulong)(uint)argc;
  uVar8 = (long)local_78 * 8 + 0xfU & 0xfffffffffffffff0;
  ppcVar16 = (char **)(auStack_98 + -uVar8 + -uVar8);
  local_70 = (undefined1 *)ppcVar16;
  *(undefined8 *)((long)ppcVar16 + -8) = 0x101375;
  r = roaring_bitmap_create_with_capacity(0);
  local_50 = (undefined1 *)CONCAT71(local_50._1_7_,1);
  ppcVar25 = (char **)0x1;
  local_88 = 0;
  local_68 = auStack_98 + -uVar8;
  local_58 = argv;
LAB_00101392:
  pcVar2 = argv[(long)ppcVar25];
  local_60 = ppcVar25;
  *(undefined8 *)((long)ppcVar16 + -8) = 0x1013a9;
  __stream = fopen(pcVar2,"r");
  if (__stream == (FILE *)0x0) {
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10141e;
    printf("Could not open file %s\n",pcVar2);
LAB_00101432:
    pvVar10 = (void *)0x0;
  }
  else {
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1013c0;
    fseek(__stream,0,2);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1013c8;
    sVar9 = ftell(__stream);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1013d3;
    rewind(__stream);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1013dd;
    pvVar10 = malloc(sVar9 + 1);
    if (pvVar10 == (void *)0x0) {
      *(undefined8 *)((long)ppcVar16 + -8) = 0x101428;
      fclose(__stream);
      goto LAB_00101432;
    }
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1013f8;
    sVar11 = fread(pvVar10,sVar9,1,__stream);
    if (sVar11 != 1) {
      *(undefined8 *)((long)ppcVar16 + -8) = 0x101432;
      free(pvVar10);
      goto LAB_00101432;
    }
    *(undefined1 *)((long)pvVar10 + sVar9) = 0;
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10140b;
    fclose(__stream);
  }
  if (pvVar10 != (void *)0x0) {
    uVar24 = 1;
    uVar8 = 0;
    do {
      if (*(char *)((long)pvVar10 + uVar8) == ',') {
        uVar24 = uVar24 + 1;
      }
      else if (*(char *)((long)pvVar10 + uVar8) == '\0') goto LAB_0010145f;
      uVar8 = uVar8 + 1;
    } while( true );
  }
  goto LAB_0010150a;
LAB_0010145f:
  *(undefined8 *)((long)ppcVar16 + -8) = 0x10146c;
  vals = (uint32_t *)malloc(uVar24 * 4);
  if (vals == (uint32_t *)0x0) {
LAB_0010150a:
    n_args = 0;
    vals = (uint32_t *)0x0;
  }
  else {
    iVar4 = 5;
    if (uVar8 != 0) {
      uVar18 = 0;
      n_args = 0;
LAB_0010148b:
      iVar20 = iVar4;
      if (*(char *)((long)pvVar10 + uVar18) != '\0') {
LAB_00101499:
        uVar17 = uVar18 + 1;
        bVar19 = *(char *)((long)pvVar10 + uVar18) - 0x30;
        if (9 < bVar19) goto code_r0x001014a6;
        uVar5 = (uint)bVar19;
        cVar1 = *(char *)((long)pvVar10 + uVar17);
        while ((byte)(cVar1 - 0x30U) < 10) {
          uVar5 = (uint)(byte)(cVar1 - 0x30) + uVar5 * 10;
          lVar21 = uVar17 + 1;
          uVar17 = uVar17 + 1;
          cVar1 = *(char *)((long)pvVar10 + lVar21);
        }
        vals[n_args] = uVar5;
        n_args = n_args + 1;
        iVar20 = 0;
        goto LAB_001014fb;
      }
      goto LAB_00101519;
    }
    n_args = 0;
    iVar20 = iVar4;
LAB_00101519:
    if ((iVar20 == 10) || (iVar20 == 5)) {
      if (n_args != uVar24) {
        *(undefined8 *)((long)ppcVar16 + -8) = 0x10153f;
        printf("unexpected number of integers! %d %d \n",n_args & 0xffffffff,uVar24 & 0xffffffff);
      }
      *(undefined8 *)((long)ppcVar16 + -8) = 0x101547;
      free(pvVar10);
    }
    else {
      n_args = 0;
    }
  }
  argv = local_58;
  ppcVar25 = local_60;
  if (n_args == 0) {
    pcVar2 = local_58[(long)local_60];
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1016b3;
    printf("No integers found in %s\n",pcVar2);
    local_88 = 1;
  }
  else {
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10156b;
    roaring_bitmap_add_many(r,n_args,vals);
    if ((n_args & 0xfffffffe) != 0) {
      uVar8 = n_args & 0xffffffff;
      do {
        uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
        bVar19 = (byte)(pcg32_global_0 >> 0x3b);
        uVar5 = uVar5 >> bVar19 | uVar5 << 0x20 - bVar19;
        uVar24 = (ulong)uVar5;
        pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar15 = (uint)uVar8 - 1;
        if (((uint)uVar8 & uVar15) == 0) {
          uVar24 = (ulong)(uVar5 & uVar15);
        }
        else if (uVar8 < 0x80000001) {
          uVar24 = uVar8 * uVar24;
          uVar5 = (uint)uVar24;
          if ((uVar24 & 0xffffffff) < uVar8) {
            while (uVar5 <= (uint)(0xffffffff % (uVar8 & 0xffffffff))) {
              uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
              bVar19 = (byte)(pcg32_global_0 >> 0x3b);
              pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar24 = (uVar5 >> bVar19 | uVar5 << 0x20 - bVar19) * uVar8;
              uVar5 = (uint)uVar24;
            }
          }
          uVar24 = uVar24 >> 0x20;
        }
        else {
          while (uVar8 <= uVar24) {
            uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
            bVar19 = (byte)(pcg32_global_0 >> 0x3b);
            pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
            uVar24 = (ulong)(uVar5 >> bVar19 | uVar5 << 0x20 - bVar19);
          }
        }
        uVar6 = vals[uVar8 - 1];
        vals[uVar8 - 1] = vals[uVar24];
        uVar8 = uVar8 - 1;
        vals[uVar24] = uVar6;
      } while (1 < uVar8);
    }
    *(uint32_t **)(local_68 + (long)ppcVar25 * 8 + -8) = vals;
    *(ulong *)(local_70 + (long)ppcVar25 * 8 + -8) = n_args;
  }
  if (n_args == 0) goto LAB_001016d5;
  ppcVar25 = (char **)((long)ppcVar25 + 1);
  local_50 = (undefined1 *)CONCAT71(local_50._1_7_,ppcVar25 < local_78);
  if (ppcVar25 == local_78) {
LAB_001016d5:
    if (((ulong)local_50 & 1) != 0) {
      return (int)local_88;
    }
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1016ef;
    puts("Data:");
    *(undefined8 *)((long)ppcVar16 + -8) = 0x1016f7;
    uVar12 = roaring_bitmap_get_cardinality(r);
    lVar21 = 0;
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10170b;
    printf("  cardinality: %lu\n",uVar12);
    uVar5 = (r->high_low_container).size;
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10171b;
    printf("  buckets: %d\n",(ulong)uVar5);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x101723;
    uVar6 = roaring_bitmap_minimum(r);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x101732;
    uVar7 = roaring_bitmap_maximum(r);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x101748;
    printf("  range: %u-%u\n",(ulong)(uVar6 >> 0x10),(ulong)(uVar7 >> 0x10));
    *(undefined8 *)((long)ppcVar16 + -8) = 0x10175b;
    printf("Cycles/element: %d\n",10);
    *(undefined8 *)((long)ppcVar16 + -8) = 0x101769;
    printf("                          roaring_bitmap_contains:");
    do {
      lVar14 = *(long *)(local_70 + lVar21 * 8);
      local_60 = ppcVar16;
      *(undefined8 *)((long)ppcVar16 + -8) = 0x101786;
      clock_gettime(3,(timespec *)auStack_48);
      local_58 = (char **)auStack_48;
      local_50 = (undefined1 *)ts.tv_sec;
      if (lVar14 != 0) {
        lVar13 = *(long *)(local_68 + lVar21 * 8);
        lVar23 = 0;
        do {
          uVar6 = *(uint32_t *)(lVar13 + lVar23 * 4);
          *(undefined8 *)((long)ppcVar16 + -8) = 0x1017b2;
          roaring_bitmap_contains(r,uVar6);
          lVar23 = lVar23 + 1;
        } while (lVar14 != lVar23);
      }
      *(undefined8 *)((long)ppcVar16 + -8) = 0x1017cb;
      clock_gettime(3,(timespec *)auStack_48);
      lVar13 = ((long)auStack_48 - (long)local_58) * 1000000000 + (ts.tv_sec - (long)local_50);
      auVar26._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar26._0_8_ = lVar13;
      auVar26._12_4_ = 0x45300000;
      auVar27._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar27._0_8_ = lVar14;
      auVar27._12_4_ = 0x45300000;
      *(undefined8 *)((long)ppcVar16 + -8) = 0x101839;
      printf(" %10f",((auVar26._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                     ((auVar27._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)));
      ppcVar25 = local_60;
      lVar21 = lVar21 + 1;
      ppcVar16 = local_60;
    } while (lVar21 != 10);
    *(undefined8 *)((long)local_60 + -8) = 0x101854;
    putchar(10);
    puVar22 = (undefined1 *)0x0;
    *(undefined8 *)((long)ppcVar25 + -8) = 0x101865;
    printf("                     roaring_bitmap_contains_bulk:");
    do {
      lVar21 = *(long *)(local_70 + (long)puVar22 * 8);
      *(undefined8 *)((long)ppcVar25 + -8) = 0x10187e;
      local_50 = (undefined1 *)ppcVar25;
      clock_gettime(3,(timespec *)auStack_48);
      local_78 = (char **)auStack_48;
      local_58 = (char **)ts.tv_sec;
      lVar14 = *(long *)(local_68 + (long)puVar22 * 8);
      auStack_48 = (undefined1  [8])0x0;
      ts.tv_sec = 0;
      local_60 = (char **)puVar22;
      if (lVar21 != 0) {
        lVar13 = 0;
        do {
          uVar6 = *(uint32_t *)(lVar14 + lVar13 * 4);
          *(undefined8 *)((long)ppcVar25 + -8) = 0x1018bb;
          roaring_bitmap_contains_bulk(r,(roaring_bulk_context_t *)auStack_48,uVar6);
          lVar13 = lVar13 + 1;
        } while (lVar21 != lVar13);
      }
      *(undefined8 *)((long)ppcVar25 + -8) = 0x1018d0;
      clock_gettime(3,(timespec *)auStack_48);
      lVar14 = ((long)auStack_48 - (long)local_78) * 1000000000 + (ts.tv_sec - (long)local_58);
      auVar28._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar28._0_8_ = lVar14;
      auVar28._12_4_ = 0x45300000;
      auVar29._8_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar29._0_8_ = lVar21;
      auVar29._12_4_ = 0x45300000;
      *(undefined8 *)((long)ppcVar25 + -8) = 0x10193e;
      printf(" %10f",((auVar28._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                     ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0)));
      ppcVar25 = (char **)local_50;
      puVar22 = (undefined1 *)((long)local_60 + 1);
    } while (puVar22 != (undefined1 *)0xa);
    *(undefined8 *)(local_50 + -8) = 0x10195d;
    putchar(10);
    puVar3 = local_68;
    puVar22 = local_70;
    uVar8 = local_80;
    if (local_80 != 0) {
      uVar24 = 0;
      do {
        pvVar10 = *(void **)(puVar3 + uVar24 * 8);
        sVar9 = *(size_t *)(puVar22 + uVar24 * 8);
        *(undefined8 *)((long)ppcVar25 + -8) = 0x10198b;
        qsort(pvVar10,sVar9,4,compare_uint32);
        uVar24 = uVar24 + 1;
      } while (uVar8 != uVar24);
    }
    lVar21 = 0;
    *(undefined8 *)((long)ppcVar25 + -8) = 0x1019a4;
    printf("        roaring_bitmap_contains with sorted input:");
    do {
      lVar14 = *(long *)(local_70 + lVar21 * 8);
      *(undefined8 *)((long)ppcVar25 + -8) = 0x1019c1;
      local_60 = ppcVar25;
      clock_gettime(3,(timespec *)auStack_48);
      local_58 = (char **)auStack_48;
      local_50 = (undefined1 *)ts.tv_sec;
      if (lVar14 != 0) {
        lVar13 = *(long *)(local_68 + lVar21 * 8);
        lVar23 = 0;
        do {
          uVar6 = *(uint32_t *)(lVar13 + lVar23 * 4);
          *(undefined8 *)((long)ppcVar25 + -8) = 0x1019ed;
          roaring_bitmap_contains(r,uVar6);
          lVar23 = lVar23 + 1;
        } while (lVar14 != lVar23);
      }
      *(undefined8 *)((long)ppcVar25 + -8) = 0x101a06;
      clock_gettime(3,(timespec *)auStack_48);
      lVar13 = ((long)auStack_48 - (long)local_58) * 1000000000 + (ts.tv_sec - (long)local_50);
      auVar30._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar30._0_8_ = lVar13;
      auVar30._12_4_ = 0x45300000;
      auVar31._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar31._0_8_ = lVar14;
      auVar31._12_4_ = 0x45300000;
      *(undefined8 *)((long)ppcVar25 + -8) = 0x101a74;
      printf(" %10f",((auVar30._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
                     ((auVar31._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)));
      ppcVar25 = local_60;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 10);
    *(undefined8 *)((long)local_60 + -8) = 0x101a8f;
    putchar(10);
    puVar22 = (undefined1 *)0x0;
    *(undefined8 *)((long)ppcVar25 + -8) = 0x101aa0;
    printf("   roaring_bitmap_contains_bulk with sorted input:");
    do {
      lVar21 = *(long *)(local_70 + (long)puVar22 * 8);
      *(undefined8 *)((long)ppcVar25 + -8) = 0x101ab9;
      local_50 = (undefined1 *)ppcVar25;
      clock_gettime(3,(timespec *)auStack_48);
      local_78 = (char **)auStack_48;
      local_58 = (char **)ts.tv_sec;
      lVar14 = *(long *)(local_68 + (long)puVar22 * 8);
      auStack_48 = (undefined1  [8])0x0;
      ts.tv_sec = 0;
      local_60 = (char **)puVar22;
      if (lVar21 != 0) {
        lVar13 = 0;
        do {
          uVar6 = *(uint32_t *)(lVar14 + lVar13 * 4);
          *(undefined8 *)((long)ppcVar25 + -8) = 0x101af6;
          roaring_bitmap_contains_bulk(r,(roaring_bulk_context_t *)auStack_48,uVar6);
          lVar13 = lVar13 + 1;
        } while (lVar21 != lVar13);
      }
      *(undefined8 *)((long)ppcVar25 + -8) = 0x101b0b;
      clock_gettime(3,(timespec *)auStack_48);
      lVar14 = ((long)auStack_48 - (long)local_78) * 1000000000 + (ts.tv_sec - (long)local_58);
      auVar32._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar32._0_8_ = lVar14;
      auVar32._12_4_ = 0x45300000;
      auVar33._8_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar33._0_8_ = lVar21;
      auVar33._12_4_ = 0x45300000;
      *(undefined8 *)((long)ppcVar25 + -8) = 0x101b79;
      printf(" %10f",((auVar32._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                     ((auVar33._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0)));
      puVar3 = local_50;
      puVar22 = (undefined1 *)((long)local_60 + 1);
      ppcVar25 = (char **)local_50;
    } while (puVar22 != (undefined1 *)0xa);
    *(undefined8 *)(local_50 + -8) = 0x101b98;
    putchar(10);
    *(undefined8 *)(puVar3 + -8) = 0x101ba0;
    roaring_bitmap_free(r);
    puVar22 = local_68;
    uVar8 = local_80;
    if (local_80 != 0) {
      uVar24 = 0;
      do {
        pvVar10 = *(void **)(puVar22 + uVar24 * 8);
        *(undefined8 *)(puVar3 + -8) = 0x101bbb;
        free(pvVar10);
        uVar24 = uVar24 + 1;
      } while (uVar8 != uVar24);
      return 0;
    }
    return 0;
  }
  goto LAB_00101392;
code_r0x001014a6:
  uVar18 = uVar17;
  if (*(char *)((long)pvVar10 + uVar17) == '\0') goto code_r0x001014b4;
  goto LAB_00101499;
code_r0x001014b4:
  iVar20 = 10;
LAB_001014fb:
  if ((9 < bVar19) || (uVar18 = uVar17 + 1, iVar20 = iVar4, uVar8 <= uVar18)) goto LAB_00101519;
  goto LAB_0010148b;
}

Assistant:

int main(int argc, char* argv[]) {
    (void)&read_all_integer_files;  // suppress unused warning

    if (argc < 2) {
        printf("Usage: %s <comma_separated_integers_file> ...\n", argv[0]);
        printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",
               argv[0]);
        return 1;
    }

    size_t fields = argc - 1;
    uint32_t* values[argc];
    size_t count[argc];

    roaring_bitmap_t* bm = roaring_bitmap_create();
    for (int i = 1; i < argc; i++) {
        size_t t_count = 0;
        uint32_t* t_values = read_integer_file(argv[i], &t_count);
        if (t_count == 0) {
            printf("No integers found in %s\n", argv[i]);
            return 1;
        }
        roaring_bitmap_add_many(bm, t_count, t_values);

        shuffle_uint32(t_values, t_count);

        values[i - 1] = t_values;
        count[i - 1] = t_count;
    }
    // roaring_bitmap_run_optimize(bm);

    printf("Data:\n");
    printf("  cardinality: %" PRIu64 "\n", roaring_bitmap_get_cardinality(bm));
    printf("  buckets: %d\n", (int)bm->high_low_container.size);
    printf("  range: %" PRIu32 "-%" PRIu32 "\n",
           roaring_bitmap_minimum(bm) >> 16, roaring_bitmap_maximum(bm) >> 16);

    const int num_passes = 10;
    printf("Cycles/element: %d\n", num_passes);
    uint64_t cycles_start, cycles_final;

    printf("                          roaring_bitmap_contains:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("                     roaring_bitmap_contains_bulk:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    // sort input array
    for (size_t i = 0; i < fields; ++i) {
        qsort(values[i], count[i], sizeof(uint32_t), compare_uint32);
    }

    printf("        roaring_bitmap_contains with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("   roaring_bitmap_contains_bulk with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    roaring_bitmap_free(bm);
    for (size_t i = 0; i < fields; ++i) {
        free(values[i]);
    }
    return 0;
}